

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solver.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
lu::solve(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,vector<double,_std::allocator<double>_> *b)

{
  size_type __n;
  double **A_00;
  double *b_00;
  int *P_00;
  double *x_00;
  double *pdVar1;
  const_reference this;
  const_reference pvVar2;
  ulong local_80;
  size_t i_2;
  size_type local_60;
  size_t j;
  size_t i_1;
  size_t i;
  double *res;
  int *P;
  double *b_vec;
  double **A_matr;
  size_t N;
  vector<double,_std::allocator<double>_> *b_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *A_local;
  vector<double,_std::allocator<double>_> *x;
  
  __n = std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::size(A);
  A_00 = (double **)malloc(__n << 3);
  b_00 = (double *)malloc(__n << 3);
  P_00 = (int *)malloc((__n + 1) * 4);
  x_00 = (double *)malloc(__n << 3);
  for (i_1 = 0; i_1 < __n; i_1 = i_1 + 1) {
    pdVar1 = (double *)malloc(__n << 3);
    A_00[i_1] = pdVar1;
  }
  for (j = 0; j < __n; j = j + 1) {
    for (local_60 = 0; local_60 < __n; local_60 = local_60 + 1) {
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](A,j);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this,local_60);
      A_00[j][local_60] = *pvVar2;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](b,j);
    b_00[j] = *pvVar2;
  }
  A_matr._0_4_ = (int)__n;
  anon_unknown_1::LUPDecompose(A_00,(int)A_matr,0.0,P_00);
  anon_unknown_1::LUPSolve(A_00,P_00,b_00,(int)A_matr,x_00);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,__n);
  for (local_80 = 0; local_80 < __n; local_80 = local_80 + 1) {
    free(A_00[local_80]);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,x_00 + local_80);
  }
  free(A_00);
  free(b_00);
  free(P_00);
  free(x_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> solve(const std::vector<std::vector<double>> &A, const std::vector<double> &b)
{
    size_t N = A.size();
    double **A_matr = static_cast<double **>(malloc(N * sizeof(double *)));
    double *b_vec = static_cast<double *>(malloc(N * sizeof(double)));
    int *P = static_cast<int *>(malloc((N + 1) * sizeof(int)));
    double *res = static_cast<double *>(malloc(N * sizeof(double)));

    for (size_t i = 0; i < N; ++i)
    {
        A_matr[i] = static_cast<double *>(malloc(N * sizeof(double)));
    }
    for (size_t i = 0; i < N; ++i)
    {
        for (size_t j = 0; j < N; ++j)
        {
            A_matr[i][j] = A[i][j];
        }
        b_vec[i] = b[i];
    }
    LUPDecompose(A_matr, N, 0, P);
    LUPSolve(A_matr, P, b_vec, N, res);
    std::vector<double> x;
    x.reserve(N);
    for (size_t i = 0; i < N; ++i)
    {
        free(A_matr[i]);
        x.push_back(res[i]);
    }
    free(A_matr);
    free(b_vec);
    free(P);
    free(res);
    return x;
}